

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

PropertyStringCacheMap * __thiscall
Js::JavascriptLibrary::EnsurePropertyStringMap(JavascriptLibrary *this)

{
  WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>
  **ppWVar1;
  Recycler *pRVar2;
  WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>
  *this_00;
  ScriptContext *this_01;
  TrackAllocData local_38;
  JavascriptLibrary *local_10;
  JavascriptLibrary *this_local;
  
  local_10 = this;
  ppWVar1 = Memory::WriteBarrierPtr::operator_cast_to_WeakReferenceRegionDictionary__
                      ((WriteBarrierPtr *)&this->propertyStringMap);
  if (*ppWVar1 ==
      (WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>
       *)0x0) {
    pRVar2 = this->recycler;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,
               (type_info *)
               &JsUtil::
                WeakReferenceRegionDictionary<int,Js::PropertyString*,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x1b20);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_38);
    this_00 = (WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>
               *)new<Memory::Recycler>(0x40,pRVar2,0x43c4b0);
    pRVar2 = GetRecycler(this);
    JsUtil::
    WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>
    ::WeakReferenceRegionDictionary(this_00,pRVar2,0x47);
    Memory::
    WriteBarrierPtr<JsUtil::WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>_>
    ::operator=(&this->propertyStringMap,this_00);
    this_01 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                        (&(this->super_JavascriptLibraryBase).scriptContext);
    ppWVar1 = Memory::WriteBarrierPtr::operator_cast_to_WeakReferenceRegionDictionary__
                        ((WriteBarrierPtr *)&this->propertyStringMap);
    ScriptContext::RegisterWeakReferenceDictionary(this_01,(IWeakReferenceDictionary *)*ppWVar1);
  }
  ppWVar1 = Memory::WriteBarrierPtr::operator_cast_to_WeakReferenceRegionDictionary__
                      ((WriteBarrierPtr *)&this->propertyStringMap);
  return *ppWVar1;
}

Assistant:

PropertyStringCacheMap* JavascriptLibrary::EnsurePropertyStringMap()
    {
        if (this->propertyStringMap == nullptr)
        {
            this->propertyStringMap = RecyclerNew(this->recycler, PropertyStringCacheMap, this->GetRecycler(), 71);
            this->scriptContext->RegisterWeakReferenceDictionary((JsUtil::IWeakReferenceDictionary*) this->propertyStringMap);
        }
        return this->propertyStringMap;
    }